

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O2

void LexOctal(SQChar *s,SQUnsignedInteger *res)

{
  SQUnsignedInteger SVar1;
  ulong uVar2;
  
  SVar1 = 0;
  while( true ) {
    *res = SVar1;
    uVar2 = (ulong)*s;
    if (uVar2 == 0) {
      return;
    }
    if ((uVar2 & 0xfffffffffffffff8) != 0x30) break;
    s = s + 1;
    SVar1 = (uVar2 + SVar1 * 8) - 0x30;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqlexer.cpp"
                ,0x1d8,"void LexOctal(const SQChar *, SQUnsignedInteger *)");
}

Assistant:

void LexOctal(const SQChar *s,SQUnsignedInteger *res)
{
    *res = 0;
    while(*s != 0)
    {
        if(scisodigit(*s)) *res = (*res)*8+((*s++)-'0');
        else { assert(0); }
    }
}